

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O1

void obj1undo(mcmcxdef *mctx,objucxdef *undoctx)

{
  uchar uVar1;
  ushort uVar2;
  mcmon objnum;
  uint uVar3;
  undefined8 in_RAX;
  uchar *puVar4;
  ushort uVar5;
  byte unaff_R13B;
  uchar *puVar6;
  undefined4 local_34;
  
  local_34 = (undefined4)((ulong)in_RAX >> 0x20);
  uVar2 = undoctx->objucxprv;
  if (uVar2 == undoctx->objucxhead) {
    errsigf(undoctx->objucxerr,"TADS",0xc9);
  }
  undoctx->objucxhead = uVar2;
  uVar1 = undoctx->objucxbuf[uVar2];
  uVar5 = uVar2;
  if (uVar2 != undoctx->objucxtail) {
    uVar5 = *(ushort *)(undoctx->objucxbuf + (ulong)uVar2 + 1);
  }
  undoctx->objucxprv = uVar5;
  if (uVar1 != '\x03') {
    if (uVar1 == '\x05') {
      puVar6 = undoctx->objucxbuf + (ulong)uVar2 + 3;
    }
    else {
      objnum = *(mcmon *)(undoctx->objucxbuf + (ulong)uVar2 + 3);
      local_34 = *(undefined4 *)(undoctx->objucxbuf + (ulong)uVar2 + 3);
      puVar6 = undoctx->objucxbuf + (ulong)uVar2 + 7;
      puVar4 = mcmlck(mctx,objnum);
      uVar2 = *(ushort *)(puVar4 + 2);
      mcmunlck(mctx,objnum);
      unaff_R13B = (uVar2 & 2) == 0;
    }
    switch(uVar1) {
    case '\x01':
      objdelp(mctx,(objnum)local_34,local_34._2_2_,0);
      if ((unaff_R13B & 1) == 0) {
        objindx(mctx,(objnum)local_34);
        return;
      }
      break;
    case '\x02':
      objsetp(mctx,(objnum)local_34,local_34._2_2_,(uint)puVar6[2],puVar6 + 6,(objucxdef *)0x0);
      return;
    case '\x04':
      objdelp(mctx,(objnum)local_34,local_34._2_2_,0);
      uVar3 = objgetp(mctx,(objnum)local_34,local_34._2_2_,(dattyp *)0x0);
      puVar4 = mcmlck(mctx,(objnum)local_34);
      puVar4[(ulong)(uVar3 & 0xffff) + 5] = puVar4[(ulong)(uVar3 & 0xffff) + 5] & 0xfd;
      mcmunlck(mctx,(objnum)local_34);
      return;
    case '\x05':
      (*undoctx->objucxcun)(undoctx->objucxccx,puVar6);
      return;
    }
  }
  return;
}

Assistant:

void obj1undo(mcmcxdef *mctx, objucxdef *undoctx)
{
    uchar  *p;
    prpnum  prop;
    objnum  objn;
    uchar   cmd;
    uchar   pr[PRPHDRSIZ];                     /* space for property header */
    ushort  prv;
    ushort  pofs;
    objdef *objptr;
    int     indexed;

    /* if there's no more undo, signal an error */
    if (undoctx->objucxprv == undoctx->objucxhead)
        errsig(undoctx->objucxerr, ERR_NOUNDO);
    
    /* move back to previous record */
    undoctx->objucxhead = undoctx->objucxprv;
    p = &undoctx->objucxbuf[undoctx->objucxprv];
    
    /* get command, and set undocxprv to previous record */
    cmd = *p++;
    memcpy(&prv, p, sizeof(prv));
    p += sizeof(prv);
    
    /* if we're at the tail, no more undo; otherwise, use back link */
    if (undoctx->objucxprv == undoctx->objucxtail)
        undoctx->objucxprv = undoctx->objucxhead;
    else
        undoctx->objucxprv = prv;
    
    if (cmd == OBJUSAV) return;       /* savepointer marker - nothing to do */
    
    /* get object/property information for property-changing undo */
    if (cmd != OBJUCLI)
    {
        memcpy(&objn, p, (size_t)sizeof(objn));
        p += sizeof(objn);
        memcpy(&prop, p, (size_t)sizeof(prop));
        p += sizeof(prop);
        objptr = mcmlck(mctx, objn);
        indexed = (objflg(objptr) & OBJFINDEX);
        mcmunlck(mctx, objn);
    }
    
    switch(cmd)
    {
    case OBJUADD:
        objdelp(mctx, objn, prop, FALSE);
        if (indexed) objindx(mctx, objn);
        break;
        
    case OBJUOVR:
        objdelp(mctx, objn, prop, FALSE);  /* delete the non-original value */
        pofs = objgetp(mctx, objn, prop, (dattyp *)0);  /* get ignored prop */
        objptr = (objdef *)mcmlck(mctx, objn);           /* lock the object */
        prpflg(objofsp(objptr, pofs)) &= ~PRPFIGN;     /* no longer ignored */
        mcmunlck(mctx, objn);                          /* unlock the object */
        break;
        
    case OBJUCHG:
        memcpy(pr, p, (size_t)PRPHDRSIZ);
        p += PRPHDRSIZ;
        objsetp(mctx, objn, prop, prptype(pr), (void *)p, (objucxdef *)0);
        break;
        
    case OBJUCLI:
        (*undoctx->objucxcun)(undoctx->objucxccx, p);
        break;
    }
}